

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O3

int N_VBufUnpack_Serial(N_Vector x,void *buf)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  
  iVar2 = -1;
  if (buf != (void *)0x0 && x != (N_Vector)0x0) {
    lVar3 = (long)*x->content;
    if (lVar3 < 1) {
      return 0;
    }
    lVar1 = *(long *)((long)x->content + 8);
    iVar2 = 0;
    lVar4 = 0;
    do {
      *(undefined8 *)(lVar1 + lVar4 * 8) = *(undefined8 *)((long)buf + lVar4 * 8);
      lVar4 = lVar4 + 1;
    } while (lVar3 != lVar4);
  }
  return iVar2;
}

Assistant:

int N_VBufUnpack_Serial(N_Vector x, void *buf)
{
  sunindextype i, N;
  realtype     *xd = NULL;
  realtype     *bd = NULL;

  if (x == NULL || buf == NULL) return(-1);

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  bd = (realtype*) buf;

  for (i = 0; i < N; i++)
    xd[i] = bd[i];

  return(0);
}